

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::ToBinaryWithoutAttachedDebugInsts
          (Instruction *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  bool bVar1;
  uint32_t uVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator local_48;
  reference local_40;
  Operand *operand;
  const_iterator __end2;
  const_iterator __begin2;
  OperandList *__range2;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvStack_18;
  uint32_t num_words;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  Instruction *this_local;
  
  pvStack_18 = (vector<unsigned_int,std::allocator<unsigned_int>> *)binary;
  binary_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  uVar2 = NumOperandWords(this);
  __range2._4_4_ = uVar2 + 1;
  __range2._0_4_ = __range2._4_4_ * 0x10000 | this->opcode_ & 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18,
             (value_type *)&__range2);
  __end2 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::begin
                     (&this->operands_);
  operand = (Operand *)
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::end
                      (&this->operands_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                                *)&operand);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
               ::operator*(&__end2);
    this_00 = pvStack_18;
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_48,&local_50);
    __first = utils::SmallVector<unsigned_int,_2UL>::begin(&local_40->words);
    __last = utils::SmallVector<unsigned_int,_2UL>::end(&local_40->words);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
              (this_00,local_48,__first,__last);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Instruction::ToBinaryWithoutAttachedDebugInsts(
    std::vector<uint32_t>* binary) const {
  const uint32_t num_words = 1 + NumOperandWords();
  binary->push_back((num_words << 16) | static_cast<uint16_t>(opcode_));
  for (const auto& operand : operands_) {
    binary->insert(binary->end(), operand.words.begin(), operand.words.end());
  }
}